

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_math.c
# Opt level: O0

size_t ares_count_hexdigits(size_t n)

{
  undefined8 local_18;
  size_t digits;
  size_t n_local;
  
  local_18 = 0;
  for (digits = n; digits != 0; digits = digits >> 4) {
    local_18 = local_18 + 1;
  }
  if (local_18 == 0) {
    local_18 = 1;
  }
  return local_18;
}

Assistant:

size_t ares_count_hexdigits(size_t n)
{
  size_t digits;

  for (digits = 0; n > 0; digits++) {
    n /= 16;
  }
  if (digits == 0) {
    digits = 1;
  }

  return digits;
}